

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

GraphPath * __thiscall
QMultiHash<QtGraphicsAnchorLayout::AnchorVertex*,QtGraphicsAnchorLayout::GraphPath>::
valueImpl<QtGraphicsAnchorLayout::AnchorVertex*>
          (QMultiHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::GraphPath>
           *this,AnchorVertex **key)

{
  MultiNode<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::GraphPath> *pMVar1;
  AnchorVertex **in_RDI;
  Node *n;
  Data<QHashPrivate::MultiNode<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::GraphPath>_>
  *in_stack_ffffffffffffffe0;
  Chain *local_8;
  
  if ((*in_RDI == (AnchorVertex *)0x0) ||
     (pMVar1 = QHashPrivate::
               Data<QHashPrivate::MultiNode<QtGraphicsAnchorLayout::AnchorVertex*,QtGraphicsAnchorLayout::GraphPath>>
               ::findNode<QtGraphicsAnchorLayout::AnchorVertex*>(in_stack_ffffffffffffffe0,in_RDI),
     pMVar1 == (MultiNode<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::GraphPath>
                *)0x0)) {
    local_8 = (Chain *)0x0;
  }
  else {
    local_8 = pMVar1->value;
  }
  return &local_8->value;
}

Assistant:

T *valueImpl(const K &key) const noexcept
    {
        if (d) {
            Node *n = d->findNode(key);
            if (n) {
                Q_ASSERT(n->value);
                return &n->value->value;
            }
        }
        return nullptr;
    }